

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_grouping(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_grp **groupings)

{
  lysp_node_grp *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_node_grp *parent_00;
  lysp_node_grp *plVar4;
  char *pcVar5;
  char **ppcVar6;
  char *format;
  ly_ctx *plVar7;
  ly_stmt lVar8;
  bool bVar9;
  lysp_ext_instance **in_stack_ffffffffffffff60;
  ly_stmt kw;
  lysp_node **local_90;
  char *word;
  lysp_ext_instance **local_80;
  size_t word_len;
  lysp_node_action **local_70;
  lysp_node_notif **local_68;
  char **local_60;
  char **local_58;
  uint16_t *local_50;
  lysp_tpdf **local_48;
  lysp_node_grp **local_40;
  char *buf;
  
  parent_00 = (lysp_node_grp *)calloc(1,0x68);
  if (parent_00 == (lysp_node_grp *)0x0) {
    LVar3 = LY_EMEM;
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_grouping");
  }
  else {
    plVar1 = *groupings;
    if (*groupings != (lysp_node_grp *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = (lysp_node_grp *)(plVar4->field_0).node.next;
      } while (plVar1 != (lysp_node_grp *)0x0);
      groupings = &(plVar4->field_0).field_1.next;
    }
    *groupings = parent_00;
    LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
    if (LVar3 == LY_SUCCESS) {
      if (buf == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar5 = word;
        if (word_len == 0) {
          pcVar5 = "";
        }
        LVar3 = lydict_insert(plVar7,pcVar5,word_len,&(parent_00->field_0).node.name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar3 = lydict_insert_zc(plVar7,word,&(parent_00->field_0).node.name);
      }
      if (LVar3 == LY_SUCCESS) {
        (parent_00->field_0).node.nodetype = 0x4000;
        (parent_00->field_0).node.parent = parent;
        LVar3 = get_keyword(ctx,&kw,&word,&word_len);
        if (LVar3 == LY_SUCCESS) {
          if (kw == LY_STMT_SYNTAX_SEMICOLON) {
            bVar9 = false;
          }
          else {
            if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar7 = (ly_ctx *)0x0;
              }
              else {
                plVar7 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar5 = lyplg_ext_stmt2str(kw);
              ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
              return LY_EVALID;
            }
            LVar3 = get_keyword(ctx,&kw,&word,&word_len);
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          }
          local_80 = &(parent_00->field_0).node.exts;
          local_68 = &parent_00->notifs;
          local_40 = &parent_00->groupings;
          local_70 = &parent_00->actions;
          local_48 = &parent_00->typedefs;
          local_90 = &parent_00->child;
          local_50 = &(parent_00->field_0).node.flags;
          local_58 = &(parent_00->field_0).node.ref;
          local_60 = &(parent_00->field_0).node.dsc;
          lVar8 = kw;
          do {
            if (!bVar9) {
              if (parent == (lysp_node *)0x0) {
                return LY_SUCCESS;
              }
              if (ctx->main_ctx != (lysp_ctx *)0x0) {
                LVar3 = ly_set_add(&ctx->main_ctx->grps_nodes,parent,'\0',(uint32_t *)0x0);
                if (LVar3 != LY_SUCCESS) {
                  return LVar3 + (LVar3 == LY_SUCCESS);
                }
                return LY_SUCCESS;
              }
              __assert_fail("ctx->main_ctx",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                            ,0xc6a,
                            "LY_ERR parse_grouping(struct lysp_yang_ctx *, struct lysp_node *, struct lysp_node_grp **)"
                           );
            }
            if (lVar8 == LY_STMT_NOTIFICATION) {
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                pcVar5 = "notification";
LAB_00171433:
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
LAB_00171463:
                ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar5,"grouping");
                return LY_EVALID;
              }
              LVar3 = parse_notif(ctx,(lysp_node *)parent_00,local_68);
            }
            else if (lVar8 == LY_STMT_ACTION) {
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                pcVar5 = "action";
                goto LAB_00171433;
              }
              LVar3 = parse_action(ctx,(lysp_node *)parent_00,local_70);
            }
            else {
              if (lVar8 == LY_STMT_ANYDATA) {
                plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                if (*(byte *)&plVar2[2].schema < 2) {
                  plVar7 = (ly_ctx *)**(undefined8 **)plVar2;
                  pcVar5 = "anydata";
                  goto LAB_00171433;
                }
              }
              else if (lVar8 != LY_STMT_ANYXML) {
                if (lVar8 == LY_STMT_CHOICE) {
                  LVar3 = parse_choice(ctx,(lysp_node *)parent_00,local_90);
                }
                else if (lVar8 == LY_STMT_CONTAINER) {
                  LVar3 = parse_container(ctx,(lysp_node *)parent_00,local_90);
                }
                else if (lVar8 == LY_STMT_GROUPING) {
                  LVar3 = parse_grouping(ctx,(lysp_node *)parent_00,local_40);
                }
                else if (lVar8 == LY_STMT_LEAF) {
                  LVar3 = parse_leaf(ctx,(lysp_node *)parent_00,local_90);
                }
                else if (lVar8 == LY_STMT_LEAF_LIST) {
                  LVar3 = parse_leaflist(ctx,(lysp_node *)parent_00,local_90);
                }
                else if (lVar8 == LY_STMT_LIST) {
                  LVar3 = parse_list(ctx,(lysp_node *)parent_00,local_90);
                }
                else if (lVar8 == LY_STMT_USES) {
                  LVar3 = parse_uses(ctx,(lysp_node *)parent_00,local_90);
                }
                else if (lVar8 == LY_STMT_TYPEDEF) {
                  LVar3 = parse_typedef(ctx,(lysp_node *)parent_00,local_48);
                }
                else if (lVar8 == LY_STMT_EXTENSION_INSTANCE) {
                  LVar3 = parse_ext(ctx,word,word_len,parent_00,LY_STMT_GROUPING,0,local_80);
                }
                else {
                  if (lVar8 == LY_STMT_REFERENCE) {
                    pcVar5 = *local_58;
                    lVar8 = LY_STMT_REFERENCE;
                    ppcVar6 = local_58;
                  }
                  else {
                    if (lVar8 == LY_STMT_STATUS) {
                      LVar3 = parse_status(ctx,local_50,local_80);
                      goto LAB_001712df;
                    }
                    if (lVar8 != LY_STMT_DESCRIPTION) {
                      if (ctx == (lysp_yang_ctx *)0x0) {
                        plVar7 = (ly_ctx *)0x0;
                      }
                      else {
                        plVar7 = (ly_ctx *)
                                 **(undefined8 **)
                                   (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                      }
                      pcVar5 = lyplg_ext_stmt2str(lVar8);
                      format = "Invalid keyword \"%s\" as a child of \"%s\".";
                      goto LAB_00171463;
                    }
                    pcVar5 = *local_60;
                    lVar8 = LY_STMT_DESCRIPTION;
                    ppcVar6 = local_60;
                  }
                  LVar3 = parse_text_field(ctx,pcVar5,lVar8,(uint32_t)ppcVar6,(char **)0x2,
                                           Y_IDENTIF_ARG,(uint16_t *)local_80,
                                           in_stack_ffffffffffffff60);
                }
                goto LAB_001712df;
              }
              LVar3 = parse_any(ctx,lVar8,(lysp_node *)parent_00,local_90);
            }
LAB_001712df:
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            LVar3 = get_keyword(ctx,&kw,&word,&word_len);
            lVar8 = kw;
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
            if (((!bVar9) && (*local_80 != (lysp_ext_instance *)0x0)) &&
               (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*local_80,'\x01',(uint32_t *)0x0),
               LVar3 != LY_SUCCESS)) {
              return LVar3;
            }
          } while( true );
        }
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_grouping(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_grp **groupings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_grp *grp;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), groupings, grp, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, grp->name, word, word_len, ret, cleanup);
    grp->nodetype = LYS_GROUPING;
    grp->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, grp->dsc, LY_STMT_DESCRIPTION, 0, &grp->dsc, Y_STR_ARG, NULL, &grp->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, grp->ref, LY_STMT_REFERENCE, 0, &grp->ref, Y_STR_ARG, NULL, &grp->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &grp->flags, &grp->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "grouping");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, &grp->node, &grp->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, &grp->node, &grp->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, &grp->node, &grp->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, &grp->node, &grp->typedefs));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "grouping");
            LY_CHECK_RET(parse_action(ctx, &grp->node, &grp->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, &grp->node, &grp->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "grouping");
            LY_CHECK_RET(parse_notif(ctx, &grp->node, &grp->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, grp, LY_STMT_GROUPING, 0, &grp->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "grouping");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, grp->exts, ret, cleanup);
    }

    /* store data for collision check */
    if (parent) {
        assert(ctx->main_ctx);
        LY_CHECK_RET(ly_set_add(&ctx->main_ctx->grps_nodes, parent, 0, NULL));
    }

cleanup:
    return ret;
}